

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

bool google::protobuf::io::Tokenizer::ParseInteger(string *text,uint64_t max_value,uint64_t *output)

{
  char cVar1;
  byte bVar2;
  char cVar3;
  char *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  pcVar4 = (text->_M_dataplus)._M_p;
  if (*pcVar4 == '0') {
    if ((byte)(pcVar4[1] | 0x20U) == 0x78) {
      pcVar4 = pcVar4 + 2;
      uVar7 = 0x1000000000000000;
      uVar8 = 0x10;
    }
    else {
      uVar7 = 0x2000000000000000;
      uVar8 = 8;
    }
  }
  else {
    uVar7 = 0x199999999999999a;
    uVar8 = 10;
  }
  uVar9 = 0;
  pbVar6 = (byte *)(pcVar4 + 1);
  do {
    pbVar5 = pbVar6;
    uVar10 = (ulong)pbVar5[-1];
    if (uVar10 == 0) goto LAB_00234b12;
    cVar1 = (anonymous_namespace)::kAsciiToInt[uVar10];
    uVar11 = (long)cVar1;
    if (uVar10 == 0x30) {
      uVar11 = uVar9;
    }
    if ((int)cVar1 < (int)uVar8) {
      uVar9 = uVar11;
    }
    cVar3 = (uVar10 != 0x30) * '\x03';
    if ((int)uVar8 <= (int)cVar1) {
      cVar3 = '\x01';
    }
    pbVar6 = pbVar5 + 1;
  } while (cVar3 == '\0');
  if (cVar3 == '\x03') {
    bVar2 = *pbVar5;
    if (bVar2 != 0) {
      do {
        if ((int)uVar8 <= (int)(char)(anonymous_namespace)::kAsciiToInt[bVar2]) {
          return false;
        }
        if (uVar7 <= uVar9) {
          return false;
        }
        uVar9 = (ulong)(uint)(int)(char)(anonymous_namespace)::kAsciiToInt[bVar2] + uVar9 * uVar8;
        if (uVar9 < uVar8) {
          return false;
        }
        bVar2 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      } while (bVar2 != 0);
    }
LAB_00234b12:
    if (uVar9 <= max_value) {
      *output = uVar9;
      return true;
    }
  }
  return false;
}

Assistant:

Tokenizer::Tokenizer(ZeroCopyInputStream* input,
                     ErrorCollector* error_collector)
    : input_(input),
      error_collector_(error_collector),
      buffer_(nullptr),
      buffer_size_(0),
      buffer_pos_(0),
      read_error_(false),
      line_(0),
      column_(0),
      record_target_(nullptr),
      record_start_(-1),
      allow_f_after_float_(false),
      comment_style_(CPP_COMMENT_STYLE),
      require_space_after_number_(true),
      allow_multiline_strings_(false) {
  current_.line = 0;
  current_.column = 0;
  current_.end_column = 0;
  current_.type = TYPE_START;
  previous_ = current_;

  Refresh();
}